

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O0

bool testFromStdString(String *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  size_type sVar6;
  String *str_local;
  
  pcVar3 = cm::String::data(str);
  pcVar4 = (char *)std::__cxx11::string::data();
  if (pcVar3 == pcVar4) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(str.data() != stdstr.data()) failed on line ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa6);
    std::operator<<(poVar5,"\n");
    str_local._7_1_ = false;
  }
  else {
    sVar6 = cm::String::size(str);
    if (sVar6 == 3) {
      pcVar3 = cm::String::data(str);
      pcVar4 = (char *)std::__cxx11::string::data();
      iVar2 = strncmp(pcVar3,pcVar4,3);
      if (iVar2 == 0) {
        bVar1 = cm::String::is_stable(str);
        if (bVar1) {
          str_local._7_1_ = true;
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(str.is_stable()) failed on line ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaa);
          std::operator<<(poVar5,"\n");
          str_local._7_1_ = false;
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(std::strncmp(str.data(), stdstr.data(), 3) == 0) failed on line "
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa9);
        std::operator<<(poVar5,"\n");
        str_local._7_1_ = false;
      }
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ")
      ;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xa8);
      std::operator<<(poVar5,"\n");
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

static bool testFromStdString(cm::String const& str)
{
#if defined(_GLIBCXX_USE_CXX11_ABI) && _GLIBCXX_USE_CXX11_ABI
  // It would be nice to check this everywhere, but several platforms
  // still use a CoW implementation even in C++11.
  ASSERT_TRUE(str.data() != stdstr.data());
#endif
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), stdstr.data(), 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}